

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

int ply_read_header(p_ply ply)

{
  int iVar1;
  uint uVar2;
  long in_RAX;
  ushort **ppuVar3;
  t_ply_idriver_conflict *ptVar4;
  p_ply_element __dest;
  p_ply_property __dest_00;
  size_t sVar5;
  char *pcVar6;
  int i;
  e_ply_storage_mode eVar7;
  e_ply_type eVar8;
  long lVar9;
  long local_38;
  
  if (((ply == (p_ply)0x0) || (ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_READ)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,400,"int ply_read_header(p_ply)");
  }
  local_38 = in_RAX;
  iVar1 = BREFILL(ply);
  if (iVar1 == 0) {
    pcVar6 = "Unable to read magic number from file";
  }
  else {
    if (((ply->buffer[0] == 'p') && (ply->buffer[1] == 'l')) && (ply->buffer[2] == 'y')) {
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (long)ply->buffer[3] * 2 + 1) & 0x20) != 0) {
        uVar2 = 0;
        if (ply->buffer[3] == '\r') {
          uVar2 = (uint)(ply->buffer[4] == '\n');
        }
        ply->rn = uVar2;
        ply->buffer_first = ply->buffer_first + 3;
        iVar1 = ply_read_word(ply);
        if (iVar1 == 0) {
          return 0;
        }
        if ((ply->fp == (FILE *)0x0) || (ply->io_mode != PLY_READ)) {
          __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                        ,0x4ae,"int ply_read_header_format(p_ply)");
        }
        iVar1 = strcmp(ply->buffer + ply->buffer_token,"format");
        if ((iVar1 == 0) && (iVar1 = ply_read_word(ply), iVar1 != 0)) {
          sVar5 = ply->buffer_token;
          pcVar6 = "binary_big_endian";
          lVar9 = 0;
          do {
            iVar1 = strcmp(pcVar6,ply->buffer + sVar5);
            if (iVar1 == 0) {
              eVar7 = (e_ply_storage_mode)lVar9;
              ply->storage_mode = eVar7;
              if (eVar7 != ~PLY_BIG_ENDIAN) {
                if (eVar7 == PLY_ASCII) {
                  ptVar4 = &ply_idriver_ascii;
                }
                else if (eVar7 == PLY_LITTLE_ENDIAN) {
                  ptVar4 = &ply_idriver_binary;
                }
                else {
                  ptVar4 = &ply_idriver_binary_reverse;
                }
                ply->idriver = ptVar4;
                iVar1 = ply_read_word(ply);
                if (((iVar1 != 0) &&
                    (iVar1 = strcmp(ply->buffer + ply->buffer_token,"1.0"), iVar1 == 0)) &&
                   (iVar1 = ply_read_word(ply), iVar1 != 0)) {
                  iVar1 = strcmp(ply->buffer + ply->buffer_token,"end_header");
                  while (iVar1 != 0) {
                    iVar1 = ply_read_header_comment(ply);
                    if (iVar1 == 0) {
                      if ((ply->fp == (FILE *)0x0) || (ply->io_mode != PLY_READ)) {
                        __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                                      ,0x4ee,"int ply_read_header_element(p_ply)");
                      }
                      iVar1 = strcmp(ply->buffer + ply->buffer_token,"element");
                      if (((iVar1 == 0) &&
                          (__dest = ply_grow_element(ply), __dest != (p_ply_element)0x0)) &&
                         (iVar1 = ply_read_word(ply), iVar1 != 0)) {
                        strcpy(__dest->name,ply->buffer + ply->buffer_token);
                        iVar1 = ply_read_word(ply);
                        if (iVar1 != 0) {
                          iVar1 = __isoc99_sscanf(ply->buffer + ply->buffer_token,"%ld",&local_38);
                          if (iVar1 == 1) {
                            __dest->ninstances = local_38;
                            iVar1 = ply_read_word(ply);
                            if (iVar1 != 0) {
LAB_00117ae3:
                              iVar1 = strcmp(ply->buffer + ply->buffer_token,"property");
                              if (((iVar1 == 0) &&
                                  (__dest_00 = ply_grow_property(ply,ply->element +
                                                                     ply->nelements + -1),
                                  __dest_00 != (p_ply_property)0x0)) &&
                                 (iVar1 = ply_read_word(ply), iVar1 != 0)) {
                                sVar5 = ply->buffer_token;
                                lVar9 = 0;
                                pcVar6 = "int8";
                                do {
                                  iVar1 = strcmp(pcVar6,ply->buffer + sVar5);
                                  if (iVar1 == 0) {
                                    eVar8 = (e_ply_type)lVar9;
                                    __dest_00->type = eVar8;
                                    if (eVar8 == ~PLY_INT8) goto LAB_00117af9;
                                    if (eVar8 != PLY_LIST) goto LAB_00117c7a;
                                    iVar1 = ply_read_word(ply);
                                    if (iVar1 == 0) goto LAB_00117af9;
                                    sVar5 = ply->buffer_token;
                                    lVar9 = 0;
                                    pcVar6 = "int8";
                                    goto LAB_00117bdb;
                                  }
                                  pcVar6 = ply_type_list[lVar9 + 1];
                                  lVar9 = lVar9 + 1;
                                } while (lVar9 != 0x11);
                                __dest_00->type = ~PLY_INT8;
                              }
                              goto LAB_00117af9;
                            }
                          }
                          else {
                            ply_ferror(ply,"Expected number got \'%s\'",
                                       ply->buffer + ply->buffer_token);
                          }
                        }
                      }
                      iVar1 = ply_read_header_obj_info(ply);
                      if (iVar1 == 0) {
                        ply_ferror(ply,"Unexpected token \'%s\'",ply->buffer + ply->buffer_token);
                        return 0;
                      }
                    }
LAB_00117a4c:
                    iVar1 = strcmp(ply->buffer + ply->buffer_token,"end_header");
                  }
                  if (ply->rn == 0) {
                    return 1;
                  }
                  sVar5 = ply->buffer_first;
                  if (ply->buffer_last != sVar5) {
LAB_00117d16:
                    ply->buffer_first = sVar5 + 1;
                    return 1;
                  }
                  iVar1 = BREFILL(ply);
                  if (iVar1 != 0) {
                    sVar5 = ply->buffer_first;
                    goto LAB_00117d16;
                  }
                  pcVar6 = "Unexpected end of file";
                  goto LAB_00117904;
                }
              }
              goto LAB_001178fd;
            }
            pcVar6 = ply_storage_mode_list[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          ply->storage_mode = ~PLY_BIG_ENDIAN;
        }
LAB_001178fd:
        pcVar6 = "Invalid file format";
LAB_00117904:
        ply_ferror(ply,pcVar6);
        return 0;
      }
    }
    pcVar6 = "Wrong magic number. Expected \'ply\'";
  }
  (*ply->error_cb)(ply,pcVar6);
  return 0;
  while( true ) {
    pcVar6 = ply_type_list[lVar9 + 1];
    lVar9 = lVar9 + 1;
    if (lVar9 == 0x11) break;
LAB_00117bdb:
    iVar1 = strcmp(pcVar6,ply->buffer + sVar5);
    if (iVar1 == 0) {
      __dest_00->length_type = (e_ply_type)lVar9;
      iVar1 = ply_read_word(ply);
      if (iVar1 == 0) goto LAB_00117af9;
      sVar5 = ply->buffer_token;
      lVar9 = 0;
      pcVar6 = "int8";
      goto LAB_00117c3b;
    }
  }
  __dest_00->length_type = ~PLY_INT8;
  goto LAB_00117af9;
LAB_00117c3b:
  iVar1 = strcmp(pcVar6,ply->buffer + sVar5);
  if (iVar1 != 0) goto code_r0x00117c47;
  __dest_00->value_type = (e_ply_type)lVar9;
LAB_00117c7a:
  iVar1 = ply_read_word(ply);
  if (iVar1 == 0) goto LAB_00117af9;
  strcpy(__dest_00->name,ply->buffer + ply->buffer_token);
  iVar1 = ply_read_word(ply);
  if (iVar1 != 0) goto LAB_00117ae3;
LAB_00117af9:
  iVar1 = ply_read_header_comment(ply);
  if ((iVar1 != 0) || (iVar1 = ply_read_header_obj_info(ply), iVar1 != 0)) goto LAB_00117ae3;
  goto LAB_00117a4c;
code_r0x00117c47:
  pcVar6 = ply_type_list[lVar9 + 1];
  lVar9 = lVar9 + 1;
  if (lVar9 == 0x11) goto code_r0x00117c5c;
  goto LAB_00117c3b;
code_r0x00117c5c:
  __dest_00->value_type = ~PLY_INT8;
  goto LAB_00117af9;
}

Assistant:

int ply_read_header(p_ply ply) {
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    if (!ply_read_header_magic(ply)) return 0;
    if (!ply_read_word(ply)) return 0;
    /* parse file format */
    if (!ply_read_header_format(ply)) {
        ply_ferror(ply, "Invalid file format");
        return 0;
    }
    /* parse elements, comments or obj_infos until the end of header */
    while (strcmp(BWORD(ply), "end_header")) {
        if (!ply_read_header_comment(ply) &&
                !ply_read_header_element(ply) &&
                !ply_read_header_obj_info(ply)) {
            ply_ferror(ply, "Unexpected token '%s'", BWORD(ply));
            return 0;
        }
    }
    /* skip extra character? */
    if (ply->rn) {
        if (BSIZE(ply) < 1 && !BREFILL(ply)) {
            ply_ferror(ply, "Unexpected end of file");
            return 0;
        }
        BSKIP(ply, 1);
    }
    return 1;
}